

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_0::CallFinder::~CallFinder(CallFinder *this)

{
  pointer this_00;
  pointer this_01;
  size_t in_RDX;
  size_t __n;
  
  this_00 = (this->infos).
            super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
  ::_M_deallocate((_Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                   *)this_00,
                  (pointer)((long)(this->infos).
                                  super__Vector_base<wasm::(anonymous_namespace)::CallInfo,_std::allocator<wasm::(anonymous_namespace)::CallInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00
                           >> 4),in_RDX);
  this_01 = (this->
            super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            ).
            super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
  ::_M_deallocate((_Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                   *)this_01,
                  (pointer)((long)*(pointer *)
                                   ((long)&(this->
                                           super_PostWalker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                           ).
                                           super_Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>
                                           .stack.flexible.
                                           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::CallFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CallFinder,_void>_>::Task>_>
                                           ._M_impl.super__Vector_impl_data + 0x10) - (long)this_01
                           >> 4),__n);
  return;
}

Assistant:

void visitCall(Call* curr) {
    // Add the call as not having a drop, and update the drop later if we are.
    infos.push_back(CallInfo{curr, nullptr});
  }